

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O3

FT_Error tt_face_load_strike_metrics(TT_Face face,FT_ULong strike_index,FT_Size_Metrics *metrics)

{
  byte bVar1;
  FT_Byte FVar2;
  FT_Byte FVar3;
  FT_Byte FVar4;
  FT_Byte *pFVar5;
  FT_Stream stream;
  FT_UInt16 FVar6;
  FT_Error FVar7;
  FT_Long FVar8;
  uint uVar9;
  long lVar10;
  ushort uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  if (face->sbit_strike_map == (FT_UInt *)0x0) {
    if (face->sbit_num_strikes <= strike_index) {
      return 6;
    }
  }
  else {
    if ((ulong)(long)(face->root).num_fixed_sizes <= strike_index) {
      return 6;
    }
    strike_index = (FT_ULong)face->sbit_strike_map[strike_index];
  }
  if (1 < face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC) {
    if (face->sbit_table_type != TT_SBIT_TABLE_TYPE_SBIX) {
      return 2;
    }
    uVar9 = *(uint *)(face->sbit_table + strike_index * 4 + 8);
    uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    if (face->ebdt_size < (ulong)(uVar9 + 4)) {
      return 3;
    }
    stream = (face->root).stream;
    FVar7 = FT_Stream_Seek(stream,(ulong)uVar9 + face->ebdt_start);
    if (FVar7 != 0) {
      return FVar7;
    }
    FVar7 = FT_Stream_EnterFrame(stream,4);
    if (FVar7 != 0) {
      return FVar7;
    }
    FVar6 = FT_Stream_GetUShort(stream);
    FT_Stream_GetUShort(stream);
    FT_Stream_ExitFrame(stream);
    metrics->x_ppem = FVar6;
    metrics->y_ppem = FVar6;
    FVar8 = FT_DivFix((ulong)FVar6 << 6,(ulong)(face->header).Units_Per_EM);
    lVar12 = (long)(face->horizontal).Ascender;
    lVar10 = (long)(int)FVar8;
    lVar13 = lVar10 * lVar12;
    metrics->ascender = lVar13 + 0x8000 + (lVar13 >> 0x3f) >> 0x10;
    lVar13 = (long)(face->horizontal).Descender;
    lVar14 = lVar10 * lVar13;
    metrics->descender = lVar14 + 0x8000 + (lVar14 >> 0x3f) >> 0x10;
    lVar12 = ((long)(face->horizontal).Line_Gap + (lVar12 - lVar13)) * lVar10;
    metrics->height = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
    lVar10 = (ulong)(face->horizontal).advance_Width_Max * lVar10;
    metrics->max_advance = lVar10 + 0x8000 + (lVar10 >> 0x3f) >> 0x10;
    metrics->x_scale = FVar8;
    goto LAB_002452f1;
  }
  pFVar5 = face->sbit_table;
  lVar10 = strike_index * 0x30;
  bVar1 = pFVar5[lVar10 + 0x34];
  metrics->x_ppem = (ushort)bVar1;
  uVar11 = (ushort)pFVar5[lVar10 + 0x35];
  metrics->y_ppem = uVar11;
  FVar2 = pFVar5[lVar10 + 0x18];
  lVar13 = (long)(char)FVar2 << 6;
  metrics->ascender = lVar13;
  FVar3 = pFVar5[lVar10 + 0x19];
  lVar14 = (long)(char)FVar3;
  lVar12 = lVar14 * 0x40;
  metrics->descender = lVar12;
  FVar4 = pFVar5[lVar10 + 0x21];
  if (lVar14 < 1) {
    if (FVar3 == '\0' && FVar2 == '\0') {
      if (pFVar5[lVar10 + 0x20] == '\0' && FVar4 == '\0') {
        lVar13 = (ulong)uVar11 << 6;
        metrics->ascender = lVar13;
        lVar12 = 0;
      }
      else {
        lVar13 = (long)(int)(char)pFVar5[lVar10 + 0x20] << 6;
        metrics->ascender = lVar13;
        lVar12 = (long)(int)(char)FVar4 << 6;
      }
      goto LAB_0024528f;
    }
  }
  else if ((char)FVar4 < '\0') {
    lVar12 = lVar14 * -0x40;
LAB_0024528f:
    metrics->descender = lVar12;
  }
  metrics->height = lVar13 - lVar12;
  if (lVar13 - lVar12 == 0) {
    metrics->height = (ulong)uVar11 * 0x40;
    metrics->descender = lVar12 + (ulong)uVar11 * -0x40;
  }
  metrics->max_advance =
       ((long)(char)pFVar5[lVar10 + 0x1f] +
       (ulong)pFVar5[lVar10 + 0x1a] + (long)(char)pFVar5[lVar10 + 0x1e]) * 0x40;
  FVar8 = FT_DivFix((ulong)(ushort)bVar1 << 6,(ulong)(face->header).Units_Per_EM);
  metrics->x_scale = FVar8;
  FVar8 = FT_DivFix((ulong)metrics->y_ppem << 6,(ulong)(face->header).Units_Per_EM);
LAB_002452f1:
  metrics->y_scale = FVar8;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_strike_metrics( TT_Face           face,
                               FT_ULong          strike_index,
                               FT_Size_Metrics*  metrics )
  {
    /* we have to test for the existence of `sbit_strike_map'    */
    /* because the function gets also used at the very beginning */
    /* to construct `sbit_strike_map' itself                     */
    if ( face->sbit_strike_map )
    {
      if ( strike_index >= (FT_ULong)face->root.num_fixed_sizes )
        return FT_THROW( Invalid_Argument );

      /* map to real index */
      strike_index = face->sbit_strike_map[strike_index];
    }
    else
    {
      if ( strike_index >= (FT_ULong)face->sbit_num_strikes )
        return FT_THROW( Invalid_Argument );
    }

    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        FT_Byte*  strike;
        FT_Char   max_before_bl;
        FT_Char   min_after_bl;


        strike = face->sbit_table + 8 + strike_index * 48;

        metrics->x_ppem = (FT_UShort)strike[44];
        metrics->y_ppem = (FT_UShort)strike[45];

        metrics->ascender  = (FT_Char)strike[16] * 64;  /* hori.ascender  */
        metrics->descender = (FT_Char)strike[17] * 64;  /* hori.descender */

        /* Due to fuzzy wording in the EBLC documentation, we find both */
        /* positive and negative values for `descender'.  Additionally, */
        /* many fonts have both `ascender' and `descender' set to zero  */
        /* (which is definitely wrong).  MS Windows simply ignores all  */
        /* those values...  For these reasons we apply some heuristics  */
        /* to get a reasonable, non-zero value for the height.          */

        max_before_bl = (FT_Char)strike[24];
        min_after_bl  = (FT_Char)strike[25];

        if ( metrics->descender > 0 )
        {
          /* compare sign of descender with `min_after_bl' */
          if ( min_after_bl < 0 )
            metrics->descender = -metrics->descender;
        }

        else if ( metrics->descender == 0 )
        {
          if ( metrics->ascender == 0 )
          {
            FT_TRACE2(( "tt_face_load_strike_metrics:"
                        " sanitizing invalid ascender and descender\n" ));
            FT_TRACE2(( "                            "
                        " values for strike %ld (%dppem, %dppem)\n",
                        strike_index,
                        metrics->x_ppem, metrics->y_ppem ));

            /* sanitize buggy ascender and descender values */
            if ( max_before_bl || min_after_bl )
            {
              metrics->ascender  = max_before_bl * 64;
              metrics->descender = min_after_bl * 64;
            }
            else
            {
              metrics->ascender  = metrics->y_ppem * 64;
              metrics->descender = 0;
            }
          }
        }

#if 0
        else
          ; /* if we have a negative descender, simply use it */
#endif

        metrics->height = metrics->ascender - metrics->descender;
        if ( metrics->height == 0 )
        {
          FT_TRACE2(( "tt_face_load_strike_metrics:"
                      " sanitizing invalid height value\n" ));
          FT_TRACE2(( "                            "
                      " for strike (%d, %d)\n",
                      metrics->x_ppem, metrics->y_ppem ));
          metrics->height    = metrics->y_ppem * 64;
          metrics->descender = metrics->ascender - metrics->height;
        }

        /* Is this correct? */
        metrics->max_advance = ( (FT_Char)strike[22] + /* min_origin_SB  */
                                          strike[18] + /* max_width      */
                                 (FT_Char)strike[23]   /* min_advance_SB */
                                                     ) * 64;

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = FT_DivFix( metrics->x_ppem * 64,
                                      face->header.Units_Per_EM );
        metrics->y_scale = FT_DivFix( metrics->y_ppem * 64,
                                      face->header.Units_Per_EM );

        return FT_Err_Ok;
      }

    case TT_SBIT_TABLE_TYPE_SBIX:
      {
        FT_Stream       stream = face->root.stream;
        FT_UInt         offset;
        FT_UShort       ppem, resolution;
        TT_HoriHeader  *hori;
        FT_Fixed        scale;

        FT_Error  error;
        FT_Byte*  p;


        p      = face->sbit_table + 8 + 4 * strike_index;
        offset = FT_NEXT_ULONG( p );

        if ( offset + 4 > face->ebdt_size )
          return FT_THROW( Invalid_File_Format );

        if ( FT_STREAM_SEEK( face->ebdt_start + offset ) ||
             FT_FRAME_ENTER( 4 )                         )
          return error;

        ppem       = FT_GET_USHORT();
        resolution = FT_GET_USHORT();

        FT_UNUSED( resolution ); /* What to do with this? */

        FT_FRAME_EXIT();

        metrics->x_ppem = ppem;
        metrics->y_ppem = ppem;

        scale = FT_DivFix( ppem * 64, face->header.Units_Per_EM );
        hori  = &face->horizontal;

        metrics->ascender    = FT_MulFix( hori->Ascender, scale );
        metrics->descender   = FT_MulFix( hori->Descender, scale );
        metrics->height      =
          FT_MulFix( hori->Ascender - hori->Descender + hori->Line_Gap,
                     scale );
        metrics->max_advance = FT_MulFix( hori->advance_Width_Max, scale );

        /* set the scale values (in 16.16 units) so advances */
        /* from the hmtx and vmtx table are scaled correctly */
        metrics->x_scale = scale;
        metrics->y_scale = scale;

        return error;
      }

    default:
      return FT_THROW( Unknown_File_Format );
    }
  }